

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::CloseGap
          (RepeatedPtrFieldBase *this,int start,int num)

{
  int iVar1;
  Rep *pRVar2;
  long lVar3;
  
  if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
    if (start == 0 && num == 1) {
      this->tagged_rep_or_elem_ = (void *)0x0;
    }
  }
  else {
    pRVar2 = rep(this);
    iVar1 = pRVar2->allocated_size;
    if (start + num < iVar1) {
      lVar3 = (long)(start + num);
      do {
        *(void **)((long)pRVar2 + lVar3 * 8 + (long)num * -8 + 8) = pRVar2->elements[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar1);
    }
    pRVar2->allocated_size = iVar1 - num;
  }
  this->current_size_ = this->current_size_ - num;
  return;
}

Assistant:

void RepeatedPtrFieldBase::CloseGap(int start, int num) {
  if (using_sso()) {
    if (start == 0 && num == 1) {
      tagged_rep_or_elem_ = nullptr;
    }
  } else {
    // Close up a gap of "num" elements starting at offset "start".
    Rep* r = rep();
    for (int i = start + num; i < r->allocated_size; ++i)
      r->elements[i - num] = r->elements[i];
    r->allocated_size -= num;
  }
  ExchangeCurrentSize(current_size_ - num);
}